

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::FederateError::~FederateError(FederateError *this)

{
  void *in_RDI;
  
  ~FederateError((FederateError *)0x257af8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

FederateError(int errorCode, std::string_view message) noexcept:
        HelicsException(message), code(errorCode)
    {
    }